

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<512U,_unsigned_int,_void,_false> * __thiscall
math::wide_integer::gcd<512u,unsigned_int,void,false>
          (uintwide_t<512U,_unsigned_int,_void,_false> *__return_storage_ptr__,wide_integer *this,
          uintwide_t<512U,_unsigned_int,_void,_false> *a,
          uintwide_t<512U,_unsigned_int,_void,_false> *b)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  enable_if_t<std::is_integral<unsigned_long>::value,_bool> eVar4;
  uint uVar5;
  array<unsigned_int,_16UL> *paVar6;
  const_iterator puVar7;
  uint *puVar8;
  unsigned_long v_00;
  unsigned_fast_type n;
  enable_if_t<std::is_integral<unsigned_int>::value,_bool> local_172;
  enable_if_t<std::is_integral<unsigned_int>::value,_bool> local_171;
  wide_integer local_160 [64];
  undefined1 local_120 [64];
  unsigned_long local_e0;
  local_ularge_type u_large;
  local_ularge_type v_large;
  local_ushort_type my_u_hi;
  local_ushort_type my_v_hi;
  unsigned_long local_c0;
  unsigned_fast_type left_shift_amount;
  unsigned_fast_type v_shift;
  unsigned_fast_type u_shift;
  uint local_a0;
  undefined1 local_9c [8];
  local_wide_integer_type v;
  local_wide_integer_type u;
  bool v_is_neg;
  bool u_is_neg;
  uintwide_t<512U,_unsigned_int,_void,_false> *b_local;
  uintwide_t<512U,_unsigned_int,_void,_false> *a_local;
  
  bVar1 = uintwide_t<512U,_unsigned_int,_void,_false>::is_neg<false>
                    ((uintwide_t<24U,_unsigned_char,_void,_false> *)this,
                     (enable_if_t<(_false),_int> *)0x0);
  bVar2 = uintwide_t<512U,_unsigned_int,_void,_false>::is_neg<false>
                    ((uintwide_t<24U,_unsigned_char,_void,_false> *)a,
                     (enable_if_t<(_false),_int> *)0x0);
  if (bVar1) {
    uintwide_t<512U,_unsigned_int,_void,_false>::operator-
              ((uintwide_t<512U,_unsigned_int,_void,_false> *)
               (v.values.super_array<unsigned_int,_16UL>.elems + 0xe));
  }
  else {
    memcpy(v.values.super_array<unsigned_int,_16UL>.elems + 0xe,this,0x40);
  }
  if (bVar2) {
    uintwide_t<512U,_unsigned_int,_void,_false>::operator-
              ((uintwide_t<512U,_unsigned_int,_void,_false> *)local_9c);
  }
  else {
    memcpy(local_9c,a,0x40);
  }
  uintwide_t<512U,_unsigned_int,_void,_false>::uintwide_t(__return_storage_ptr__);
  bVar3 = uintwide_t<512U,_unsigned_int,_void,_false>::operator==
                    ((uintwide_t<512U,_unsigned_int,_void,_false> *)
                     (v.values.super_array<unsigned_int,_16UL>.elems + 0xe),
                     (uintwide_t<512U,_unsigned_int,_void,_false> *)local_9c);
  if (bVar3) {
    memcpy(__return_storage_ptr__,v.values.super_array<unsigned_int,_16UL>.elems + 0xe,0x40);
  }
  else {
    uVar5 = uintwide_t::operator_cast_to_unsigned_int((uintwide_t *)local_9c);
    local_171 = false;
    if (uVar5 == 0) {
      local_a0 = 0;
      local_171 = operator==((uintwide_t<512U,_unsigned_int,_void,_false> *)local_9c,&local_a0);
    }
    if (local_171 == false) {
      uVar5 = uintwide_t::operator_cast_to_unsigned_int
                        ((uintwide_t *)(v.values.super_array<unsigned_int,_16UL>.elems + 0xe));
      local_172 = false;
      if (uVar5 == 0) {
        u_shift._4_4_ = 0;
        local_172 = operator==((uintwide_t<512U,_unsigned_int,_void,_false> *)
                               (v.values.super_array<unsigned_int,_16UL>.elems + 0xe),
                               (uint *)((long)&u_shift + 4));
      }
      if (local_172 == false) {
        v_shift = lsb<512u,unsigned_int,void,false>
                            ((uintwide_t<512U,_unsigned_int,_void,_false> *)
                             (v.values.super_array<unsigned_int,_16UL>.elems + 0xe));
        left_shift_amount =
             lsb<512u,unsigned_int,void,false>
                       ((uintwide_t<512U,_unsigned_int,_void,_false> *)local_9c);
        local_c0 = detail::min_unsafe<unsigned_long>(&v_shift,&left_shift_amount);
        uintwide_t<512u,unsigned_int,void,false>::operator>>=
                  ((uintwide_t<512u,unsigned_int,void,false> *)
                   (v.values.super_array<unsigned_int,_16UL>.elems + 0xe),v_shift);
        uintwide_t<512u,unsigned_int,void,false>::operator>>=
                  ((uintwide_t<512u,unsigned_int,void,false> *)local_9c,left_shift_amount);
        while( true ) {
          bVar3 = uintwide_t<512U,_unsigned_int,_void,_false>::operator>
                            ((uintwide_t<512U,_unsigned_int,_void,_false> *)
                             (v.values.super_array<unsigned_int,_16UL>.elems + 0xe),
                             (uintwide_t<512U,_unsigned_int,_void,_false> *)local_9c);
          if (bVar3) {
            swap<512u,unsigned_int,void,false>
                      ((uintwide_t<512U,_unsigned_int,_void,_false> *)
                       (v.values.super_array<unsigned_int,_16UL>.elems + 0xe),
                       (uintwide_t<512U,_unsigned_int,_void,_false> *)local_9c);
          }
          bVar3 = uintwide_t<512U,_unsigned_int,_void,_false>::operator==
                            ((uintwide_t<512U,_unsigned_int,_void,_false> *)
                             (v.values.super_array<unsigned_int,_16UL>.elems + 0xe),
                             (uintwide_t<512U,_unsigned_int,_void,_false> *)local_9c);
          if (bVar3) goto LAB_002a8440;
          _my_u_hi = std::numeric_limits<unsigned_long>::max();
          eVar4 = operator<=((uintwide_t<512U,_unsigned_int,_void,_false> *)local_9c,
                             (unsigned_long *)&my_u_hi);
          if (eVar4) break;
          uintwide_t<512U,_unsigned_int,_void,_false>::operator-=
                    ((uintwide_t<512U,_unsigned_int,_void,_false> *)local_9c,
                     (uintwide_t<24U,_unsigned_char,_void,_false> *)
                     (v.values.super_array<unsigned_int,_16UL>.elems + 0xe));
          n = lsb<512u,unsigned_int,void,false>
                        ((uintwide_t<512U,_unsigned_int,_void,_false> *)local_9c);
          uintwide_t<512u,unsigned_int,void,false>::operator>>=
                    ((uintwide_t<512u,unsigned_int,void,false> *)local_9c,n);
        }
        paVar6 = (array<unsigned_int,_16UL> *)
                 uintwide_t<512U,_unsigned_int,_void,_false>::crepresentation
                           ((uintwide_t<512U,_unsigned_int,_void,_false> *)local_9c);
        puVar7 = detail::array_detail::array<unsigned_int,_16UL>::cbegin(paVar6);
        puVar8 = detail::advance_and_point<unsigned_int_const*,unsigned_int>(puVar7,1);
        v_large._4_4_ = *puVar8;
        paVar6 = (array<unsigned_int,_16UL> *)
                 uintwide_t<512U,_unsigned_int,_void,_false>::crepresentation
                           ((uintwide_t<512U,_unsigned_int,_void,_false> *)
                            (v.values.super_array<unsigned_int,_16UL>.elems + 0xe));
        puVar7 = detail::array_detail::array<unsigned_int,_16UL>::cbegin(paVar6);
        puVar8 = detail::advance_and_point<unsigned_int_const*,unsigned_int>(puVar7,1);
        v_large._0_4_ = *puVar8;
        paVar6 = (array<unsigned_int,_16UL> *)
                 uintwide_t<512U,_unsigned_int,_void,_false>::crepresentation
                           ((uintwide_t<512U,_unsigned_int,_void,_false> *)local_9c);
        puVar7 = detail::array_detail::array<unsigned_int,_16UL>::cbegin(paVar6);
        u_large = detail::make_large<unsigned_int,unsigned_long>
                            (puVar7,(uint *)((long)&v_large + 4));
        paVar6 = (array<unsigned_int,_16UL> *)
                 uintwide_t<512U,_unsigned_int,_void,_false>::crepresentation
                           ((uintwide_t<512U,_unsigned_int,_void,_false> *)
                            (v.values.super_array<unsigned_int,_16UL>.elems + 0xe));
        puVar7 = detail::array_detail::array<unsigned_int,_16UL>::cbegin(paVar6);
        local_e0 = detail::make_large<unsigned_int,unsigned_long>(puVar7,(uint *)&v_large);
        v_00 = detail::integer_gcd_reduce<unsigned_long>(u_large,local_e0);
        uintwide_t<512u,unsigned_int,void,false>::uintwide_t<unsigned_long>(unsigned_long,std::
        enable_if<(std::is_integral<unsigned_long>::value&&std::is_unsigned<unsigned_long>::
        value)&&((std::numeric_limits<unsigned_long>::digits>std::numeric_limits<unsigned_int>::
        digits)),void>::type__
                  (local_120,v_00,
                   (enable_if_t<(std::is_integral<unsigned_long>::value_&&_std::is_unsigned<unsigned_long>::value_&&_(std::numeric_limits<unsigned_long>::digits_>_std__numeric_limits<limb_type>__digits__>
                    *)0x0);
        memcpy(v.values.super_array<unsigned_int,_16UL>.elems + 0xe,local_120,0x40);
LAB_002a8440:
        operator<<(local_160,
                   (uintwide_t<24U,_unsigned_char,_void,_false> *)
                   (v.values.super_array<unsigned_int,_16UL>.elems + 0xe),local_c0);
        memcpy(__return_storage_ptr__,local_160,0x40);
      }
      else {
        memcpy(__return_storage_ptr__,local_9c,0x40);
      }
    }
    else {
      memcpy(__return_storage_ptr__,v.values.super_array<unsigned_int,_16UL>.elems + 0xe,0x40);
    }
  }
  if (bVar1 != bVar2) {
    uintwide_t<512U,_unsigned_int,_void,_false>::negate(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr auto gcd(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& a, // NOLINT(readability-function-cognitive-complexity,bugprone-easily-swappable-parameters)
                     const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& b) -> uintwide_t<Width2, LimbType, AllocatorType, IsSigned>
  {
    // This implementation of GCD is an adaptation
    // of existing code from Boost.Multiprecision.

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;
    using local_ushort_type       = typename local_wide_integer_type::limb_type;
    using local_ularge_type       = typename local_wide_integer_type::double_limb_type;

    const auto u_is_neg = local_wide_integer_type::is_neg(a);
    const auto v_is_neg = local_wide_integer_type::is_neg(b);

    local_wide_integer_type u((!u_is_neg) ? a : -a);
    local_wide_integer_type v((!v_is_neg) ? b : -b);

    local_wide_integer_type result;

    using local_size_type = typename local_wide_integer_type::representation_type::size_type;

    if(u == v)
    { // NOLINT(bugprone-branch-clone)
      // This handles cases having (u = v) and also (u = v = 0).
      result = std::move(u); // LCOV_EXCL_LINE
    }
    else if((static_cast<local_ushort_type>(v) == static_cast<local_ushort_type>(UINT8_C(0))) && (v == static_cast<unsigned>(UINT8_C(0))))
    {
      // This handles cases having (v = 0) with (u != 0).
      result = std::move(u); // LCOV_EXCL_LINE
    }
    else if((static_cast<local_ushort_type>(u) == static_cast<local_ushort_type>(UINT8_C(0))) && (u == static_cast<unsigned>(UINT8_C(0))))
    {
      // This handles cases having (u = 0) with (v != 0).
      result = std::move(v); // LCOV_EXCL_LINE
    }
    else
    {
      // Now we handle cases having (u != 0) and (v != 0).

      // Let shift := lg K, where K is the greatest
      // power of 2 dividing both u and v.

      const unsigned_fast_type u_shift = lsb(u);
      const unsigned_fast_type v_shift = lsb(v);

      const unsigned_fast_type left_shift_amount = (detail::min_unsafe)(u_shift, v_shift);

      u >>= u_shift;
      v >>= v_shift;

      for(;;)
      {
        // Now u and v are both odd, so diff(u, v) is even.
        // Let u = min(u, v), v = diff(u, v) / 2.

        if(u > v)
        {
          swap(u, v);
        }

        if(u == v)
        {
          break;
        }

        if(v <= (std::numeric_limits<local_ularge_type>::max)())
        {
          const auto my_v_hi =
            static_cast<local_ushort_type>
            (
              (v.crepresentation().size() >= static_cast<typename local_wide_integer_type::representation_type::size_type>(UINT8_C(2)))
                ? static_cast<local_ushort_type>(*detail::advance_and_point(v.crepresentation().cbegin(), static_cast<local_size_type>(UINT8_C(1))))
                : static_cast<local_ushort_type>(UINT8_C(0))
            );

          const auto my_u_hi =
            static_cast<local_ushort_type>
            (
              (u.crepresentation().size() >= static_cast<typename local_wide_integer_type::representation_type::size_type>(UINT8_C(2)))
                ? static_cast<local_ushort_type>(*detail::advance_and_point(u.crepresentation().cbegin(), static_cast<local_size_type>(UINT8_C(1))))
                : static_cast<local_ushort_type>(UINT8_C(0))
            );

          const local_ularge_type v_large = detail::make_large(*v.crepresentation().cbegin(), my_v_hi);
          const local_ularge_type u_large = detail::make_large(*u.crepresentation().cbegin(), my_u_hi);

          u = detail::integer_gcd_reduce(v_large, u_large);

          break;
        }

        v  -= u;
        v >>= lsb(v);
      }

      result = (u << left_shift_amount);
    }
   
    if(u_is_neg != v_is_neg)
    {
      result.negate();
    }

    return result;
  }